

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool operator!=(ON_SubDEdgeSharpness *lhs,ON_SubDEdgeSharpness *rhs)

{
  bool local_32;
  bool local_31;
  float *r;
  float *l;
  ON_SubDEdgeSharpness *rhs_local;
  ON_SubDEdgeSharpness *lhs_local;
  
  if ((lhs->m_edge_sharpness[0] != rhs->m_edge_sharpness[0]) ||
     (NAN(lhs->m_edge_sharpness[0]) || NAN(rhs->m_edge_sharpness[0]))) {
    local_31 = false;
    if ((lhs->m_edge_sharpness[1] == lhs->m_edge_sharpness[1]) &&
       (!NAN(lhs->m_edge_sharpness[1]) && !NAN(lhs->m_edge_sharpness[1]))) {
      local_31 = rhs->m_edge_sharpness[1] == rhs->m_edge_sharpness[1];
    }
    lhs_local._7_1_ = local_31;
  }
  else if ((lhs->m_edge_sharpness[1] != rhs->m_edge_sharpness[1]) ||
          (NAN(lhs->m_edge_sharpness[1]) || NAN(rhs->m_edge_sharpness[1]))) {
    local_32 = false;
    if ((lhs->m_edge_sharpness[0] == lhs->m_edge_sharpness[0]) &&
       (!NAN(lhs->m_edge_sharpness[0]) && !NAN(lhs->m_edge_sharpness[0]))) {
      local_32 = rhs->m_edge_sharpness[0] == rhs->m_edge_sharpness[0];
    }
    lhs_local._7_1_ = local_32;
  }
  else {
    lhs_local._7_1_ = false;
  }
  return lhs_local._7_1_;
}

Assistant:

bool operator!=(const ON_SubDEdgeSharpness& lhs, const ON_SubDEdgeSharpness& rhs)
{
  const float* l = (const float*)(&lhs);
  const float* r = (const float*)(&rhs);

  // The compare must be done this way so
  // any nan results in false being returned.
  // (Note: x==x and x!=x are both false when x = nan.)
  if (l[0] != r[0])
    return (l[1] == l[1] && r[1] == r[1]);
  if (l[1] != r[1])
    return (l[0] == l[0] && r[0] == r[0]);
  return false;
}